

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_server.c
# Opt level: O0

void send_ping(cio_timer *timer,void *handler_context,cio_error err)

{
  char *data;
  cio_error cVar1;
  cio_write_buffer *wbe;
  size_t length;
  undefined1 local_58 [8];
  cio_write_buffer wbh;
  ws_echo_handler *echo_handler;
  cio_websocket_location_handler *handler;
  cio_websocket *websocket;
  cio_error err_local;
  void *handler_context_local;
  cio_timer *timer_local;
  
  if (err == CIO_SUCCESS) {
    fprintf(_stdout,"Sending ping!\n");
    wbh.data.element.length = (long)handler_context - 0x188;
    cio_write_buffer_head_init((cio_write_buffer *)local_58);
    data = send_ping::ping_message;
    wbe = (cio_write_buffer *)(wbh.data.element.length + 0x588);
    length = strlen(send_ping::ping_message);
    cio_write_buffer_const_element_init(wbe,data,length);
    cio_write_buffer_queue_head
              ((cio_write_buffer *)local_58,(cio_write_buffer *)(wbh.data.element.length + 0x588));
    cVar1 = cio_websocket_write_ping
                      ((cio_websocket *)handler_context,(cio_write_buffer *)local_58,ping_written,
                       timer);
    if (cVar1 != CIO_SUCCESS) {
      fprintf(_stderr,"Could not start writing websocket ping!\n");
    }
  }
  else if (err != CIO_OPERATION_ABORTED) {
    fprintf(_stderr,"ping timer failed!\n");
    cVar1 = cio_websocket_close((cio_websocket *)handler_context,CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR,
                                (char *)0x0,(cio_websocket_write_handler_t)0x0,(void *)0x0);
    if (cVar1 != CIO_SUCCESS) {
      fprintf(_stderr,"Could not start writing websocket close!\n");
    }
  }
  return;
}

Assistant:

static void send_ping(struct cio_timer *timer, void *handler_context, enum cio_error err)
{
	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	if (err == CIO_SUCCESS) {
		(void)fprintf(stdout, "Sending ping!\n");

		struct cio_websocket_location_handler *handler = cio_container_of(websocket, struct cio_websocket_location_handler, websocket);
		struct ws_echo_handler *echo_handler = cio_container_of(handler, struct ws_echo_handler, ws_handler);

		struct cio_write_buffer wbh;
		cio_write_buffer_head_init(&wbh);
		static const char *ping_message = "ping";
		cio_write_buffer_const_element_init(&echo_handler->wb_ping_message, ping_message, strlen(ping_message));
		cio_write_buffer_queue_head(&wbh, &echo_handler->wb_ping_message);
		err = cio_websocket_write_ping(websocket, &wbh, ping_written, timer);
		if (err != CIO_SUCCESS) {
			(void)fprintf(stderr, "Could not start writing websocket ping!\n");
		}
	} else if (err != CIO_OPERATION_ABORTED) {
		(void)fprintf(stderr, "ping timer failed!\n");
		err = cio_websocket_close(websocket, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, NULL, NULL, NULL);
		if (err != CIO_SUCCESS) {
			(void)fprintf(stderr, "Could not start writing websocket close!\n");
		}
	}
}